

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS ref_metric_imply_non_tet(REF_DBL *metric,REF_GRID ref_grid)

{
  REF_DBL *pRVar1;
  undefined8 *puVar2;
  double dVar3;
  double dVar4;
  REF_NODE ref_node;
  REF_ADJ pRVar5;
  REF_CELL pRVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  REF_DBL RVar11;
  REF_DBL RVar12;
  REF_DBL RVar13;
  REF_DBL RVar14;
  REF_DBL RVar15;
  REF_STATUS RVar16;
  uint uVar17;
  void *__ptr;
  REF_GLOB *pRVar18;
  REF_DBL *total_node_volume;
  long lVar19;
  ulong uVar20;
  undefined8 *puVar21;
  ulong uVar22;
  REF_DBL *pRVar23;
  ulong uVar24;
  undefined8 uVar25;
  char *pcVar26;
  REF_INT cell;
  REF_DBL *pRVar27;
  int iVar28;
  long lVar29;
  double dVar30;
  double dVar31;
  REF_DBL m [6];
  REF_DBL log_m [6];
  REF_INT nodes [27];
  
  ref_node = ref_grid->node;
  uVar22 = (ulong)(uint)ref_node->max;
  if (ref_node->max < 0) {
    pcVar26 = "malloc backup of REF_DBL negative";
    uVar25 = 0x696;
LAB_001c0c84:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar25
           ,"ref_metric_imply_non_tet",pcVar26);
    return 1;
  }
  __ptr = malloc(uVar22 * 0x30);
  if (__ptr == (void *)0x0) {
    pcVar26 = "malloc backup of REF_DBL NULL";
    uVar25 = 0x696;
LAB_001c12b8:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar25
           ,"ref_metric_imply_non_tet",pcVar26);
    uVar17 = 2;
  }
  else {
    if (uVar22 == 0) {
      total_node_volume = (REF_DBL *)malloc(0);
      if (total_node_volume == (REF_DBL *)0x0) goto LAB_001c1297;
    }
    else {
      pRVar18 = ref_node->global;
      uVar20 = 0;
      do {
        if (-1 < *pRVar18) {
          uVar24 = uVar20 & 0x7fffffff0;
          uVar25 = *(undefined8 *)((long)metric + uVar24);
          uVar7 = ((undefined8 *)((long)metric + uVar24))[1];
          puVar21 = (undefined8 *)((long)metric + uVar24 + 0x10);
          uVar8 = *puVar21;
          uVar9 = puVar21[1];
          puVar21 = (undefined8 *)((long)metric + uVar24 + 0x20);
          uVar10 = puVar21[1];
          puVar2 = (undefined8 *)((long)__ptr + uVar24 + 0x20);
          *puVar2 = *puVar21;
          puVar2[1] = uVar10;
          puVar21 = (undefined8 *)((long)__ptr + uVar24 + 0x10);
          *puVar21 = uVar8;
          puVar21[1] = uVar9;
          *(undefined8 *)((long)__ptr + uVar24) = uVar25;
          ((undefined8 *)((long)__ptr + uVar24))[1] = uVar7;
        }
        uVar20 = uVar20 + 0x30;
        pRVar18 = pRVar18 + 1;
      } while (uVar22 * 0x30 != uVar20);
      total_node_volume = (REF_DBL *)malloc(uVar22 * 8);
      if (total_node_volume == (REF_DBL *)0x0) {
LAB_001c1297:
        pcVar26 = "malloc total_node_volume of REF_DBL NULL";
        uVar25 = 0x69b;
        goto LAB_001c12b8;
      }
      if (uVar22 != 0) {
        uVar20 = 0;
        memset(total_node_volume,0,uVar22 * 8);
        pRVar18 = ref_node->global;
        do {
          if ((-1 < pRVar18[uVar20]) &&
             ((((pRVar5 = ref_grid->cell[9]->ref_adj, (long)uVar20 < (long)pRVar5->nnode &&
                (pRVar5->first[uVar20] != -1)) ||
               ((pRVar5 = ref_grid->cell[10]->ref_adj, (long)uVar20 < (long)pRVar5->nnode &&
                (pRVar5->first[uVar20] != -1)))) ||
              ((pRVar5 = ref_grid->cell[0xb]->ref_adj, (long)uVar20 < (long)pRVar5->nnode &&
               (pRVar5->first[uVar20] != -1)))))) {
            puVar21 = (undefined8 *)((uVar20 * 0x30 & 0x7fffffff0) + (long)metric);
            puVar21[4] = 0;
            puVar21[5] = 0;
            puVar21[2] = 0;
            puVar21[3] = 0;
            *puVar21 = 0;
            puVar21[1] = 0;
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar22);
      }
    }
    pRVar6 = ref_grid->cell[10];
    if (0 < pRVar6->max) {
      cell = 0;
      do {
        RVar16 = ref_cell_nodes(pRVar6,cell,nodes);
        if (RVar16 == 0) {
          uVar17 = add_sub_tet(0,4,5,3,nodes,metric,total_node_volume,ref_node,pRVar6);
          if (uVar17 != 0) {
            pcVar26 = "pri sub tet";
            uVar25 = 0x6ae;
            goto LAB_001c14eb;
          }
          uVar17 = add_sub_tet(0,1,5,4,nodes,metric,total_node_volume,ref_node,pRVar6);
          if (uVar17 != 0) {
            pcVar26 = "pri sub tet";
            uVar25 = 0x6b1;
            goto LAB_001c14eb;
          }
          uVar17 = add_sub_tet(0,1,2,5,nodes,metric,total_node_volume,ref_node,pRVar6);
          if (uVar17 != 0) {
            pcVar26 = "pri sub tet";
            uVar25 = 0x6b4;
            goto LAB_001c14eb;
          }
        }
        cell = cell + 1;
      } while (cell < pRVar6->max);
    }
    pRVar6 = ref_grid->cell[9];
    if (0 < pRVar6->max) {
      iVar28 = 0;
      do {
        RVar16 = ref_cell_nodes(pRVar6,iVar28,nodes);
        if (RVar16 == 0) {
          uVar17 = add_sub_tet(0,4,1,2,nodes,metric,total_node_volume,ref_node,pRVar6);
          if (uVar17 != 0) {
            pcVar26 = "pyr sub tet";
            uVar25 = 0x6bb;
            goto LAB_001c14eb;
          }
          uVar17 = add_sub_tet(0,3,4,2,nodes,metric,total_node_volume,ref_node,pRVar6);
          if (uVar17 != 0) {
            pcVar26 = "pyr sub tet";
            uVar25 = 0x6be;
            goto LAB_001c14eb;
          }
        }
        iVar28 = iVar28 + 1;
      } while (iVar28 < pRVar6->max);
    }
    pRVar6 = ref_grid->cell[0xb];
    if (0 < pRVar6->max) {
      iVar28 = 0;
      do {
        RVar16 = ref_cell_nodes(pRVar6,iVar28,nodes);
        if (RVar16 == 0) {
          uVar17 = add_sub_tet(0,5,7,4,nodes,metric,total_node_volume,ref_node,pRVar6);
          if (uVar17 != 0) {
            pcVar26 = "hex sub tet";
            uVar25 = 0x6ca;
            goto LAB_001c14eb;
          }
          uVar17 = add_sub_tet(0,1,7,5,nodes,metric,total_node_volume,ref_node,pRVar6);
          if (uVar17 != 0) {
            pcVar26 = "hex sub tet";
            uVar25 = 0x6cd;
            goto LAB_001c14eb;
          }
          uVar17 = add_sub_tet(1,6,7,5,nodes,metric,total_node_volume,ref_node,pRVar6);
          if (uVar17 != 0) {
            pcVar26 = "hex sub tet";
            uVar25 = 0x6d0;
            goto LAB_001c14eb;
          }
          uVar17 = add_sub_tet(0,7,2,3,nodes,metric,total_node_volume,ref_node,pRVar6);
          if (uVar17 != 0) {
            pcVar26 = "hex sub tet";
            uVar25 = 0x6d4;
            goto LAB_001c14eb;
          }
          uVar17 = add_sub_tet(0,7,1,2,nodes,metric,total_node_volume,ref_node,pRVar6);
          if (uVar17 != 0) {
            pcVar26 = "hex sub tet";
            uVar25 = 0x6d7;
            goto LAB_001c14eb;
          }
          uVar17 = add_sub_tet(1,7,6,2,nodes,metric,total_node_volume,ref_node,pRVar6);
          if (uVar17 != 0) {
            pcVar26 = "hex sub tet";
            uVar25 = 0x6da;
            goto LAB_001c14eb;
          }
        }
        iVar28 = iVar28 + 1;
      } while (iVar28 < pRVar6->max);
    }
    iVar28 = ref_node->max;
    if (0 < iVar28) {
      lVar29 = 0;
      pRVar27 = metric;
      do {
        if (-1 < ref_node->global[lVar29]) {
          pRVar5 = ref_grid->cell[9]->ref_adj;
          if ((((lVar29 < pRVar5->nnode) && (pRVar5->first[lVar29] != -1)) ||
              ((pRVar5 = ref_grid->cell[10]->ref_adj, lVar29 < pRVar5->nnode &&
               (pRVar5->first[lVar29] != -1)))) ||
             ((pRVar5 = ref_grid->cell[0xb]->ref_adj, lVar29 < pRVar5->nnode &&
              (pRVar5->first[lVar29] != -1)))) {
            if (ref_node->ref_mpi->id == ref_node->part[lVar29]) {
              uVar22 = lVar29 * 0x30 & 0x7fffffff0;
              pRVar1 = (REF_DBL *)((long)metric + uVar22);
              dVar3 = total_node_volume[lVar29];
              if (dVar3 <= 0.0) {
                pRVar23 = (REF_DBL *)(uVar22 + (long)__ptr);
                RVar11 = *pRVar23;
                RVar12 = pRVar23[1];
                RVar13 = pRVar23[2];
                RVar14 = pRVar23[3];
                RVar15 = pRVar23[5];
                pRVar1[4] = pRVar23[4];
                pRVar1[5] = RVar15;
                pRVar1[2] = RVar13;
                pRVar1[3] = RVar14;
                *pRVar1 = RVar11;
                pRVar1[1] = RVar12;
                lVar19 = 0;
                do {
                  if (0x7fefffffffffffff < (ulong)ABS(pRVar27[lVar19])) {
                    pcVar26 = "backup not finite";
                    uVar25 = 0x6f5;
                    goto LAB_001c0c84;
                  }
                  lVar19 = lVar19 + 1;
                } while (lVar19 != 6);
              }
              else {
                dVar30 = dVar3 * 1e+20;
                if (dVar30 <= -dVar30) {
                  dVar30 = -dVar30;
                }
                lVar19 = 0;
                do {
                  dVar4 = pRVar27[lVar19];
                  dVar31 = dVar4;
                  if (dVar4 <= -dVar4) {
                    dVar31 = -dVar4;
                  }
                  if (dVar30 <= dVar31) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0x6e9,"ref_metric_imply_non_tet",4,"zero volume");
                    return 4;
                  }
                  log_m[lVar19] = dVar4 / dVar3;
                  lVar19 = lVar19 + 1;
                } while (lVar19 != 6);
                uVar17 = ref_matrix_exp_m(log_m,m);
                if (uVar17 != 0) {
                  pcVar26 = "exp";
                  uVar25 = 0x6ec;
                  goto LAB_001c14eb;
                }
                pRVar1[4] = m[4];
                pRVar1[5] = m[5];
                pRVar1[2] = m[2];
                pRVar1[3] = m[3];
                *pRVar1 = m[0];
                pRVar1[1] = m[1];
                total_node_volume[lVar29] = 0.0;
                lVar19 = 0;
                do {
                  if (0x7fefffffffffffff < (ulong)ABS(pRVar27[lVar19])) {
                    pcVar26 = "infer not finite";
                    uVar25 = 0x6f0;
                    goto LAB_001c0c84;
                  }
                  lVar19 = lVar19 + 1;
                } while (lVar19 != 6);
                iVar28 = ref_node->max;
              }
            }
          }
          else {
            lVar19 = 0;
            do {
              if (0x7fefffffffffffff < (ulong)ABS(pRVar27[lVar19])) {
                pcVar26 = "orig,tet not finite";
                uVar25 = 0x6fa;
                goto LAB_001c0c84;
              }
              lVar19 = lVar19 + 1;
            } while (lVar19 != 6);
          }
        }
        lVar29 = lVar29 + 1;
        pRVar27 = pRVar27 + 6;
      } while (lVar29 < iVar28);
    }
    free(total_node_volume);
    free(__ptr);
    uVar17 = ref_node_ghost_dbl(ref_node,metric,6);
    if (uVar17 == 0) {
      uVar17 = 0;
    }
    else {
      pcVar26 = "update ghosts";
      uVar25 = 0x701;
LAB_001c14eb:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             uVar25,"ref_metric_imply_non_tet",(ulong)uVar17,pcVar26);
    }
  }
  return uVar17;
}

Assistant:

REF_FCN REF_STATUS ref_metric_imply_non_tet(REF_DBL *metric,
                                            REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *total_node_volume;
  REF_DBL m[6], log_m[6];
  REF_INT node, im;
  REF_INT cell;
  REF_CELL ref_cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL *backup;

  ref_malloc(backup, 6 * ref_node_max(ref_node), REF_DBL);
  each_ref_node_valid_node(ref_node, node) {
    for (im = 0; im < 6; im++) backup[im + 6 * node] = metric[im + 6 * node];
  }

  ref_malloc_init(total_node_volume, ref_node_max(ref_node), REF_DBL, 0.0);

  each_ref_node_valid_node(ref_node, node) {
    if (ref_adj_valid(
            ref_adj_first(ref_cell_adj(ref_grid_pyr(ref_grid)), node)) ||
        ref_adj_valid(
            ref_adj_first(ref_cell_adj(ref_grid_pri(ref_grid)), node)) ||
        ref_adj_valid(
            ref_adj_first(ref_cell_adj(ref_grid_hex(ref_grid)), node))) {
      for (im = 0; im < 6; im++) {
        metric[im + 6 * node] = 0.0;
      }
    }
  }

  ref_cell = ref_grid_pri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(add_sub_tet(0, 4, 5, 3, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pri sub tet");
    RSS(add_sub_tet(0, 1, 5, 4, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pri sub tet");
    RSS(add_sub_tet(0, 1, 2, 5, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pri sub tet");
  }

  ref_cell = ref_grid_pyr(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(add_sub_tet(0, 4, 1, 2, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pyr sub tet");
    RSS(add_sub_tet(0, 3, 4, 2, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pyr sub tet");
  }

  /*
VI1 VI6 VI8 VI5  VI1 VI2 VI8 VI6  VI2 VI7 VI8 VI6
VI1 VI8 VI3 VI4  VI1 VI8 VI2 VI3  VI2 VI8 VI7 VI3
  */

  ref_cell = ref_grid_hex(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(add_sub_tet(0, 5, 7, 4, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
    RSS(add_sub_tet(0, 1, 7, 5, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
    RSS(add_sub_tet(1, 6, 7, 5, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");

    RSS(add_sub_tet(0, 7, 2, 3, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
    RSS(add_sub_tet(0, 7, 1, 2, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
    RSS(add_sub_tet(1, 7, 6, 2, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
  }

  each_ref_node_valid_node(ref_node, node) {
    if (ref_adj_valid(
            ref_adj_first(ref_cell_adj(ref_grid_pyr(ref_grid)), node)) ||
        ref_adj_valid(
            ref_adj_first(ref_cell_adj(ref_grid_pri(ref_grid)), node)) ||
        ref_adj_valid(
            ref_adj_first(ref_cell_adj(ref_grid_hex(ref_grid)), node))) {
      if (ref_node_owned(ref_node, node)) {
        if (0.0 < total_node_volume[node]) {
          for (im = 0; im < 6; im++) {
            if (!ref_math_divisible(metric[im + 6 * node],
                                    total_node_volume[node]))
              RSS(REF_DIV_ZERO, "zero volume");
            log_m[im] = metric[im + 6 * node] / total_node_volume[node];
          }
          RSS(ref_matrix_exp_m(log_m, m), "exp");
          for (im = 0; im < 6; im++) metric[im + 6 * node] = m[im];
          total_node_volume[node] = 0.0;
          for (im = 0; im < 6; im++)
            RAS(isfinite(metric[im + 6 * node]), "infer not finite");
        } else {
          for (im = 0; im < 6; im++)
            metric[im + 6 * node] = backup[im + 6 * node];
          for (im = 0; im < 6; im++)
            RAS(isfinite(metric[im + 6 * node]), "backup not finite");
        }
      }
    } else {
      for (im = 0; im < 6; im++)
        RAS(isfinite(metric[im + 6 * node]), "orig,tet not finite");
    }
  }

  ref_free(total_node_volume);
  ref_free(backup);

  RSS(ref_node_ghost_dbl(ref_node, metric, 6), "update ghosts");

  return REF_SUCCESS;
}